

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O2

uint8_t __thiscall m6502::CPY(m6502 *this)

{
  undefined1 uVar1;
  byte bVar2;
  
  fetch(this);
  uVar1 = this->fetched;
  bVar2 = this->y - uVar1;
  this->status = bVar2 & 0x80 | this->status & 0x7c | (byte)uVar1 <= this->y | (bVar2 == 0) * '\x02'
  ;
  return '\0';
}

Assistant:

uint8_t CPY()
  {
    fetch();
    uint16_t tmp = (uint16_t)y - (uint16_t)fetched;
    SetFlag(C, y >= fetched);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    return 0;
  }